

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O0

void gen_xpnd04_2(DisasContext_conflict10 *ctx)

{
  uint32_t uVar1;
  DisasContext_conflict10 *ctx_local;
  
  uVar1 = opc4(ctx->opcode);
  switch(uVar1) {
  case 0:
    gen_bcdctsq(ctx);
    break;
  default:
    gen_invalid(ctx);
    break;
  case 2:
    gen_bcdcfsq(ctx);
    break;
  case 4:
    gen_bcdctz(ctx);
    break;
  case 6:
    gen_bcdcfz(ctx);
    break;
  case 7:
    gen_bcdcfn(ctx);
    break;
  case 0x1f:
    gen_bcdsetsgn(ctx);
  }
  return;
}

Assistant:

static void gen_xpnd04_2(DisasContext *ctx)
{
    switch (opc4(ctx->opcode)) {
    case 0:
        gen_bcdctsq(ctx);
        break;
    case 2:
        gen_bcdcfsq(ctx);
        break;
    case 4:
        gen_bcdctz(ctx);
        break;
    case 6:
        gen_bcdcfz(ctx);
        break;
    case 7:
        gen_bcdcfn(ctx);
        break;
    case 31:
        gen_bcdsetsgn(ctx);
        break;
    default:
        gen_invalid(ctx);
        break;
    }
}